

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

int __thiscall
QAbstractSocketPrivate::bind(QAbstractSocketPrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  QAbstractSocket *this_00;
  QHostAddressPrivate *pQVar2;
  char cVar3;
  bool bVar4;
  quint16 qVar5;
  NetworkLayerProtocol protocol;
  undefined4 uVar6;
  SocketError errorCode;
  qintptr qVar7;
  int iVar8;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QHostAddress nullAddress;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocket **)&this->field_0x8;
  if (this->socketEngine == (QAbstractSocketEngine *)0x0) {
LAB_001b387d:
    nullAddress.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QHostAddress::QHostAddress(&nullAddress);
    QHostAddress::toString((QString *)&local_58,&nullAddress);
    resolveProxy(this,(QString *)&local_58,(quint16)__addr);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    protocol = QHostAddress::protocol((QHostAddress *)CONCAT44(in_register_00000034,__fd));
    if (protocol == UnknownNetworkLayerProtocol) {
      protocol = QHostAddress::protocol(&nullAddress);
    }
    bVar4 = initSocketLayer(this,protocol);
    QHostAddress::~QHostAddress(&nullAddress);
    if (bVar4) goto LAB_001b38f4;
  }
  else {
    cVar3 = (**(code **)(*(long *)this->socketEngine + 0x78))();
    if (cVar3 == '\0') goto LAB_001b387d;
LAB_001b38f4:
    if (__len != 0) {
      (**(code **)(*(long *)this->socketEngine + 0x118))(this->socketEngine,4,(__len & 5) != 0);
    }
    uVar6 = (**(code **)(*(long *)this->socketEngine + 0x90))
                      (this->socketEngine,(QHostAddress *)CONCAT44(in_register_00000034,__fd),
                       (ulong)__addr & 0xffff);
    qVar7 = (**(code **)(*(long *)this->socketEngine + 0x70))();
    this->cachedSocketDescriptor = qVar7;
    if ((char)uVar6 != '\0') {
      this->state = BoundState;
      QAbstractSocketEngine::localAddress((QAbstractSocketEngine *)&local_58);
      pQVar2 = (this->localAddress).d.d.ptr;
      (this->localAddress).d.d.ptr = (QHostAddressPrivate *)local_58.d;
      local_58.d = (Data *)pQVar2;
      QHostAddress::~QHostAddress((QHostAddress *)&local_58);
      qVar5 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)this->socketEngine);
      this->localPort = qVar5;
      QAbstractSocket::stateChanged(this_00,this->state);
      bVar4 = QAbstractSocket::isValid(this_00);
      iVar8 = (int)CONCAT71((uint7)(uint3)((uint)uVar6 >> 8),1);
      if ((bVar4) && (this->socketType == UdpSocket)) {
        (**(code **)(*(long *)this->socketEngine + 0x140))(this->socketEngine,1);
      }
      goto LAB_001b3a0f;
    }
    errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
    QAbstractSocketEngine::errorString
              ((QString *)&local_58,(QAbstractSocketEngine *)this->socketEngine);
    setErrorAndEmit(this,errorCode,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  iVar8 = 0;
LAB_001b3a0f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractSocketPrivate::bind(const QHostAddress &address, quint16 port, QAbstractSocket::BindMode mode)
{
    Q_Q(QAbstractSocket);

    // now check if the socket engine is initialized and to the right type
    if (!socketEngine || !socketEngine->isValid()) {
        QHostAddress nullAddress;
        resolveProxy(nullAddress.toString(), port);

        QAbstractSocket::NetworkLayerProtocol protocol = address.protocol();
        if (protocol == QAbstractSocket::UnknownNetworkLayerProtocol)
            protocol = nullAddress.protocol();

        if (!initSocketLayer(protocol))
            return false;
    }

    if (mode != QAbstractSocket::DefaultForPlatform) {
#ifdef Q_OS_UNIX
    if ((mode & QAbstractSocket::ShareAddress) || (mode & QAbstractSocket::ReuseAddressHint))
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 0);
#endif
#ifdef Q_OS_WIN
    if (mode & QAbstractSocket::ReuseAddressHint)
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::AddressReusable, 0);
    if (mode & QAbstractSocket::DontShareAddress)
        socketEngine->setOption(QAbstractSocketEngine::BindExclusively, 1);
    else
        socketEngine->setOption(QAbstractSocketEngine::BindExclusively, 0);
#endif
    }
    bool result = socketEngine->bind(address, port);
    cachedSocketDescriptor = socketEngine->socketDescriptor();

    if (!result) {
        setErrorAndEmit(socketEngine->error(), socketEngine->errorString());
        return false;
    }

    state = QAbstractSocket::BoundState;
    localAddress = socketEngine->localAddress();
    localPort = socketEngine->localPort();

    emit q->stateChanged(state);
    // A slot attached to stateChanged() signal can break our invariant:
    // by closing the socket it will reset its socket engine - thus we
    // have additional check (isValid()) ...
    if (q->isValid() && socketType == QAbstractSocket::UdpSocket)
        socketEngine->setReadNotificationEnabled(true);
    return true;
}